

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O2

void __thiscall
spirv_cross::CompilerMSL::mark_struct_members_packed(CompilerMSL *this,SPIRType *type)

{
  size_t sVar1;
  bool bVar2;
  SPIRType *type_00;
  ulong uVar3;
  
  bVar2 = Compiler::has_extended_decoration
                    ((Compiler *)this,(type->super_IVariant).self.id,
                     SPIRVCrossDecorationPhysicalTypePacked);
  if (!bVar2) {
    Compiler::set_extended_decoration
              ((Compiler *)this,(type->super_IVariant).self.id,
               SPIRVCrossDecorationPhysicalTypePacked,0);
    sVar1 = (type->member_types).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.
            buffer_size;
    for (uVar3 = 0; uVar3 != (uint)sVar1; uVar3 = uVar3 + 1) {
      type_00 = Compiler::get<spirv_cross::SPIRType>
                          ((Compiler *)this,
                           (type->member_types).
                           super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.ptr[uVar3]
                           .id);
      if (type_00->basetype == Struct) {
        while ((type_00->array).super_VectorView<unsigned_int>.buffer_size != 0) {
          type_00 = Compiler::get<spirv_cross::SPIRType>((Compiler *)this,(type_00->parent_type).id)
          ;
        }
        mark_struct_members_packed(this,type_00);
      }
      else {
        bVar2 = Compiler::is_scalar((Compiler *)this,type_00);
        if (!bVar2) {
          Compiler::set_extended_member_decoration
                    ((Compiler *)this,(type->super_IVariant).self.id,(uint32_t)uVar3,
                     SPIRVCrossDecorationPhysicalTypePacked,0);
        }
      }
    }
  }
  return;
}

Assistant:

void CompilerMSL::mark_struct_members_packed(const SPIRType &type)
{
	// Handle possible recursion when a struct contains a pointer to its own type nested somewhere.
	if (has_extended_decoration(type.self, SPIRVCrossDecorationPhysicalTypePacked))
		return;

	set_extended_decoration(type.self, SPIRVCrossDecorationPhysicalTypePacked);

	// Problem case! Struct needs to be placed at an awkward alignment.
	// Mark every member of the child struct as packed.
	uint32_t mbr_cnt = uint32_t(type.member_types.size());
	for (uint32_t i = 0; i < mbr_cnt; i++)
	{
		auto &mbr_type = get<SPIRType>(type.member_types[i]);
		if (mbr_type.basetype == SPIRType::Struct)
		{
			// Recursively mark structs as packed.
			auto *struct_type = &mbr_type;
			while (!struct_type->array.empty())
				struct_type = &get<SPIRType>(struct_type->parent_type);
			mark_struct_members_packed(*struct_type);
		}
		else if (!is_scalar(mbr_type))
			set_extended_member_decoration(type.self, i, SPIRVCrossDecorationPhysicalTypePacked);
	}
}